

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

void __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Dump
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,FILE *stream,ui32_t depth)

{
  char *pcVar1;
  _List_node_base *p_Var2;
  char identbuf [128];
  char acStack_a8 [128];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  p_Var2 = (_List_node_base *)
           &this->
            super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
  ;
  while (p_Var2 = (((_List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)
                  &this->
                   super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
        ) {
    pcVar1 = RIP::PartitionPair::EncodeString((PartitionPair *)(p_Var2 + 1),acStack_a8,0x80);
    fprintf((FILE *)stream,"  %s\n",pcVar1);
  }
  return;
}

Assistant:

void Dump(FILE* stream = 0, ui32_t depth = 0)
	    {
	      (void) depth;
	      char identbuf[IdentBufferLen];

	      if ( stream == 0 )
		stream = stderr;

	      typename std::list<T>::iterator i = this->begin();
	      for ( ; i != this->end(); i++ )
		fprintf(stream, "  %s\n", (*i).EncodeString(identbuf, IdentBufferLen));
	    }